

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

LayoutBindingTestResult * __thiscall
glcts::LayoutBindingBaseCase::drawTestCompute
          (LayoutBindingTestResult *__return_storage_ptr__,LayoutBindingBaseCase *this,GLint program
          ,int binding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  float *pfVar5;
  ulong uVar6;
  _Alloc_hider _Var7;
  bool bVar8;
  deUint32 fb_or_ssb;
  Vec4 pixel;
  GLfloat buffer [4];
  Vec4 expected;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar10;
  undefined8 uVar9;
  String local_d0;
  undefined4 local_ac;
  String local_a8;
  float local_88;
  float afStack_84 [3];
  RGBA local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68 [4];
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x16])(this);
  lVar4 = (**(code **)(**(long **)(CONCAT44(extraout_var,iVar3) + 8) + 0x18))();
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x14])(this);
  if (iVar3 != 2) {
    deAssertFail("getStage() == ComputeShader",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cLayoutBindingTests.cpp"
                 ,0x48c);
  }
  (**(code **)(lVar4 + 0x1680))(program);
  iVar3 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  if (*(int *)(CONCAT44(extraout_var_00,iVar3) + 8) == 2) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x23])
              (this,(ulong)(uint)binding);
    local_78.m_value = 0x3dcccccd;
    uStack_74 = 0x3e4ccccd;
    uStack_70 = 0x3e99999a;
    uStack_6c = 0x3ecccccd;
    (**(code **)(lVar4 + 0x6c8))(1,&local_ac);
    (**(code **)(lVar4 + 0x40))(0x90d2,local_ac);
    (**(code **)(lVar4 + 0x150))(0x90d2,0x10,&local_78,0x88ea);
    (**(code **)(lVar4 + 0x48))(0x90d2,0,local_ac);
    (**(code **)(lVar4 + 0x528))(1,1,1);
    (**(code **)(lVar4 + 0xdb8))(0x200);
    pfVar5 = (float *)(**(code **)(lVar4 + 0xd00))(0x90d2,0,0x10);
    local_88 = *pfVar5;
    afStack_84[0] = pfVar5[1];
    afStack_84[1] = pfVar5[2];
    afStack_84[2] = pfVar5[3];
    (**(code **)(lVar4 + 0x1670))(0x90d2);
    (**(code **)(lVar4 + 0x40))(0x90d2,0);
    (**(code **)(lVar4 + 0x438))(1,&local_ac);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x24])
              (this,(ulong)(uint)binding);
    local_68[0] = 0.0;
    local_68[1] = 1.0;
    local_68[2] = 0.0;
    local_68[3] = 1.0;
    bVar8 = false;
    if ((local_88 == 0.0) && (bVar8 = false, !NAN(local_88))) {
      uVar2 = 0;
      while (uVar6 = uVar2, uVar6 != 3) {
        if ((afStack_84[uVar6] != local_68[uVar6 + 1]) ||
           (uVar2 = uVar6 + 1, NAN(afStack_84[uVar6]) || NAN(local_68[uVar6 + 1]))) break;
      }
      bVar8 = 2 < uVar6;
    }
    if (bVar8 == false) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"drawTestCompute failed","");
      local_48.m_data[0] = local_68[0];
      local_48.m_data[1] = local_68[1];
      local_48.m_data[2] = local_68[2];
      local_48.m_data[3] = local_68[3];
      local_58.m_data[1] = afStack_84[0];
      local_58.m_data[0] = local_88;
      local_58.m_data[3] = afStack_84[2];
      local_58.m_data[2] = afStack_84[1];
      generateLog<tcu::Vector<float,4>,tcu::Vector<float,4>>
                (&local_d0,this,&local_a8,&local_48,&local_58);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_reason,local_d0._M_dataplus._M_p,
                 local_d0._M_dataplus._M_p + local_d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  else {
    local_78.m_value = 0x1020304;
    (**(code **)(lVar4 + 0x6f8))(1,&local_88);
    (**(code **)(lVar4 + 0xb8))(0xde1,local_88);
    (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2601);
    (**(code **)(lVar4 + 0x1380))(0xde1,1,0x8058,1,1);
    uVar9 = CONCAT44(uVar10,0x1908);
    (**(code **)(lVar4 + 0x13b8))(0xde1,0,0,0,1,1,uVar9,0x1401,&local_78);
    uVar10 = (undefined4)((ulong)uVar9 >> 0x20);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x23])
              (this,(ulong)(uint)binding);
    uVar9 = CONCAT44(uVar10,0x8058);
    (**(code **)(lVar4 + 0x80))(0,local_88,0,0,0,0x88b9,uVar9);
    uVar10 = (undefined4)((ulong)uVar9 >> 0x20);
    (**(code **)(lVar4 + 0x528))(1,1,1);
    (**(code **)(lVar4 + 0xdb8))(0x400);
    (**(code **)(lVar4 + 0x80))(0,0,0,0,0,0x88b9,CONCAT44(uVar10,0x8058));
    (**(code **)(lVar4 + 0x6d0))(1,&local_ac);
    (**(code **)(lVar4 + 0x78))(0x8d40,local_ac);
    (**(code **)(lVar4 + 0x6a0))(0x8d40,0x8ce0,0xde1,local_88,0);
    (**(code **)(lVar4 + 0x1220))(0,0,1,1,0x1908,0x1401,&local_78);
    (**(code **)(lVar4 + 0x78))(0x8d40,0);
    (**(code **)(lVar4 + 0x440))(1,&local_ac);
    (**(code **)(lVar4 + 0x480))(1,&local_88);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x24])
              (this,(ulong)(uint)binding);
    if (local_78.m_value != 0xff00ff00) {
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"drawTestCompute failed","");
      generateLog<tcu::RGBA,tcu::RGBA>(&local_d0,this,&local_a8,(RGBA)0xff00ff00,local_78);
      __return_storage_ptr__->m_passed = false;
      __return_storage_ptr__->m_notRunForThisContext = false;
      (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_reason).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_reason,local_d0._M_dataplus._M_p,
                 local_d0._M_dataplus._M_p + local_d0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,
                        CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                                 local_d0.field_2._M_local_buf[0]) + 1);
      }
      _Var7._M_p = local_a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        return __return_storage_ptr__;
      }
      goto LAB_00bccc99;
    }
    bVar8 = true;
  }
  paVar1 = &local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->m_passed = bVar8;
  __return_storage_ptr__->m_notRunForThisContext = false;
  (__return_storage_ptr__->m_reason)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_reason).field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_reason,paVar1,paVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar1) {
    return __return_storage_ptr__;
  }
  local_a8.field_2._M_allocated_capacity =
       CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,local_d0.field_2._M_local_buf[0]);
  _Var7._M_p = local_d0._M_dataplus._M_p;
LAB_00bccc99:
  operator_delete(_Var7._M_p,local_a8.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

LayoutBindingTestResult LayoutBindingBaseCase::drawTestCompute(glw::GLint program, int binding)
{
	const glw::Functions& l_gl   = getContext().getRenderContext().getFunctions();
	bool				  passed = true;

	DE_TEST_ASSERT(getStage() == ComputeShader);

	l_gl.useProgram(program);

	deUint32 fb_or_ssb;

	if (getTestParameters().surface_type == Image)
	{
		bind(binding);

		glw::GLfloat buffer[4] = { 0.1f, 0.2f, 0.3f, 0.4f };
		l_gl.genBuffers(1, &fb_or_ssb);
		l_gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, fb_or_ssb);

		l_gl.bufferData(GL_SHADER_STORAGE_BUFFER, 4 * sizeof(glw::GLfloat), buffer, GL_DYNAMIC_COPY);

		l_gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, fb_or_ssb);

		l_gl.dispatchCompute(1, 1, 1);
		l_gl.memoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		tcu::Vec4 pixel =
			*(tcu::Vec4*)l_gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * sizeof(glw::GLfloat), GL_MAP_READ_BIT);
		l_gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);

		l_gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		l_gl.deleteBuffers(1, &fb_or_ssb);

		unbind(binding);

		tcu::Vec4 expected(0.0f, 1.0f, 0.0f, 1.0f);
		passed = (pixel == expected);
		if (!passed)
		{
			return LayoutBindingTestResult(passed, generateLog(String("drawTestCompute failed"), expected, pixel));
		}
	}
	else
	{
		deUint32 something = 0x01020304, tex;

		l_gl.genTextures(1, &tex);
		l_gl.bindTexture(GL_TEXTURE_2D, tex);
		l_gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		l_gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 1, 1);
		l_gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &something);

		bind(binding);

		l_gl.bindImageTexture(0, tex, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);

		l_gl.dispatchCompute(1, 1, 1);
		l_gl.memoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);

		l_gl.bindImageTexture(0, 0, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);

		l_gl.genFramebuffers(1, &fb_or_ssb);
		l_gl.bindFramebuffer(GL_FRAMEBUFFER, fb_or_ssb);
		l_gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, tex, 0);

		l_gl.readPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &something);

		l_gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		l_gl.deleteFramebuffers(1, &fb_or_ssb);
		l_gl.deleteTextures(1, &tex);

		unbind(binding);

		const deUint32 expected = 0xff00ff00;
		passed					= (expected == something);
		if (!passed)
		{
			return LayoutBindingTestResult(
				passed, generateLog(String("drawTestCompute failed"), tcu::RGBA(expected), tcu::RGBA(something)));
		}
	}

	return passed;
}